

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_mkdtemp(void)

{
  undefined8 uVar1;
  ssize_t sVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uint file;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  __uid_t _Var4;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  uv_loop_t *puVar5;
  size_t sVar6;
  char *pcVar7;
  uv_loop_t *puVar8;
  void *pvVar9;
  int __fd;
  uv_file uVar10;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar11;
  uv_loop_t *puVar12;
  uv_fs_t *puVar13;
  uv_fs_t *puVar14;
  uv_fs_t *puVar15;
  uv_fs_t *unaff_R14;
  uv_fs_t *req;
  uv_fs_t *puVar16;
  uv_buf_t uVar17;
  uv_fs_t uStackY_1190;
  uv_loop_t *puStackY_fd8;
  code *pcStackY_fd0;
  undefined1 auStack_fb8 [576];
  uv_loop_t *puStack_d78;
  uv_loop_t *puStack_c18;
  uv_fs_t *puStack_c10;
  undefined1 auStack_bf8 [568];
  void *pvStack_9c0;
  uint uStack_9a0;
  uv_loop_t *puStack_860;
  uv_fs_t uStack_850;
  uv_loop_t *puStack_698;
  uv_fs_t *puStack_690;
  uv_fs_t uStack_678;
  uv_loop_t *puStack_4c0;
  uv_fs_t *puStack_4b8;
  uv__io_cb p_Stack_4b0;
  stat64 sStack_498;
  uv_fs_t uStack_408;
  uv_loop_t *puStack_250;
  uv_fs_t *puStack_248;
  uv_loop_t *puStack_238;
  uv_fs_t *puStack_230;
  code *pcStack_228;
  undefined1 auStack_210 [32];
  void *pvStack_198;
  uv_loop_t *puStack_38;
  code *pcStack_30;
  uv_loop_t *puStack_20;
  
  puVar5 = uv_default_loop();
  loop = puVar5;
  iVar3 = uv_fs_mkdtemp(puVar5,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if (iVar3 == 0) {
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdtemp_cb_count != 1) goto LAB_00151b15;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00151b1a;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    puVar5 = (uv_loop_t *)mkdtemp_req1.path;
    iVar3 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (iVar3 == 0) goto LAB_00151b1f;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_00151b15:
    run_test_fs_mkdtemp_cold_2();
LAB_00151b1a:
    run_test_fs_mkdtemp_cold_3();
LAB_00151b1f:
    run_test_fs_mkdtemp_cold_5();
  }
  run_test_fs_mkdtemp_cold_4();
  if (puVar5 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return extraout_EAX;
  }
  mkdtemp_cb_cold_1();
  puStack_20 = unaff_RBX;
  if (puVar5->backend_fd == UV_FS_MKDTEMP) {
    if (puVar5->watcher_queue[0] != (void *)0x0) goto LAB_00151c07;
    unaff_R14 = (uv_fs_t *)puVar5->watchers;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_00151c0c;
    pcStack_30 = (_func_void *)0x151b80;
    sVar6 = strlen((char *)unaff_R14);
    if (sVar6 != 0xf) goto LAB_00151c11;
    if ((char)unaff_R14->type != 0x5f || unaff_R14->data != (void *)0x7269645f74736574)
    goto LAB_00151c16;
    if (*(short *)&unaff_R14->field_0xd == 0x5858 &&
        *(int *)((long)&unaff_R14->type + 1) == 0x58585858) goto LAB_00151c1b;
    pcStack_30 = (_func_void *)0x151bca;
    check_permission((char *)unaff_R14,0x1c0);
    pcStack_30 = (_func_void *)0x151bde;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)puVar5->watchers,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00151c20;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_30 = (_func_void *)0x151c07;
    check_mkdtemp_result_cold_1();
    puVar5 = unaff_RBX;
LAB_00151c07:
    pcStack_30 = (_func_void *)0x151c0c;
    check_mkdtemp_result_cold_2();
LAB_00151c0c:
    pcStack_30 = (_func_void *)0x151c11;
    check_mkdtemp_result_cold_8();
LAB_00151c11:
    pcStack_30 = (_func_void *)0x151c16;
    check_mkdtemp_result_cold_3();
LAB_00151c16:
    pcStack_30 = (_func_void *)0x151c1b;
    check_mkdtemp_result_cold_4();
LAB_00151c1b:
    pcStack_30 = (_func_void *)0x151c20;
    check_mkdtemp_result_cold_7();
LAB_00151c20:
    pcStack_30 = (_func_void *)0x151c25;
    check_mkdtemp_result_cold_5();
  }
  pcStack_30 = run_test_fs_mkstemp;
  check_mkdtemp_result_cold_6();
  puVar8 = (uv_loop_t *)auStack_210;
  auStack_210[0] = 't';
  auStack_210[1] = 'e';
  auStack_210[2] = 's';
  auStack_210[3] = 't';
  auStack_210[4] = '_';
  auStack_210[5] = 'f';
  auStack_210[6] = 'i';
  auStack_210[7] = 'l';
  auStack_210[8] = 'e';
  auStack_210[9] = '_';
  auStack_210[10] = 'X';
  auStack_210[0xb] = 'X';
  auStack_210[0xc] = 'X';
  auStack_210[0xd] = 'X';
  auStack_210[0xe] = 'X';
  auStack_210[0xf] = 'X';
  auStack_210[0x10] = 0;
  pcStack_228 = (code *)0x151c4c;
  puStack_38 = puVar5;
  pcStack_30 = (code *)unaff_R14;
  pcVar7 = (char *)uv_default_loop();
  pcStack_228 = (code *)0x151c6c;
  loop = (uv_loop_t *)pcVar7;
  iVar3 = uv_fs_mkstemp((uv_loop_t *)pcVar7,&mkstemp_req1,(char *)puVar8,mkstemp_cb);
  if (iVar3 == 0) {
    pcStack_228 = (code *)0x151c82;
    pcVar7 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkstemp_cb_count != 1) goto LAB_00151ef2;
    pcVar7 = (char *)0x0;
    pcStack_228 = (code *)0x151ca4;
    iVar3 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req2,auStack_210,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00151ef7;
    pcStack_228 = (code *)0x151cb8;
    check_mkstemp_result(&mkstemp_req2);
    pcStack_228 = (code *)0x151ccb;
    pcVar7 = mkstemp_req1.path;
    iVar3 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    if (iVar3 == 0) goto LAB_00151efc;
    pcVar7 = (char *)0x0;
    pcStack_228 = (code *)0x151cea;
    iVar3 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req3,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != -0x16) goto LAB_00151f01;
    pcStack_228 = (code *)0x151d04;
    iov = uv_buf_init(test_buf,0xd);
    pcVar7 = (char *)0x0;
    pcStack_228 = (code *)0x151d40;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe10,
                        (uv_file)mkstemp_req1.result,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 != 0xd) goto LAB_00151f06;
    if (pvStack_198 != (void *)0xd) goto LAB_00151f0b;
    puVar8 = (uv_loop_t *)&stack0xfffffffffffffe10;
    pcStack_228 = (code *)0x151d65;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcStack_228 = (code *)0x151d77;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)puVar8,(uv_file)mkstemp_req1.result,(uv_fs_cb)0x0);
    pcStack_228 = (code *)0x151d7f;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcStack_228 = (code *)0x151d91;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)puVar8,(uv_file)mkstemp_req2.result,(uv_fs_cb)0x0);
    pcStack_228 = (code *)0x151d99;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcVar7 = (char *)0x0;
    pcStack_228 = (code *)0x151db2;
    file = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)puVar8,mkstemp_req1.path,0,0,(uv_fs_cb)0x0);
    if ((int)file < 0) goto LAB_00151f10;
    puVar8 = (uv_loop_t *)(ulong)file;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe10;
    pcStack_228 = (code *)0x151dc9;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_228 = (code *)0x151deb;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar7 = (char *)0x0;
    pcStack_228 = (code *)0x151e21;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,unaff_R14,file,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00151f15;
    if ((long)pvStack_198 < 0) goto LAB_00151f1a;
    pcVar7 = buf;
    pcStack_228 = (code *)0x151e4b;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00151f1f;
    pcStack_228 = (code *)0x151e60;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe10);
    pcStack_228 = (code *)0x151e6e;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe10,file,(uv_fs_cb)0x0);
    pcStack_228 = (code *)0x151e76;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe10);
    pcStack_228 = (code *)0x151e89;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_228 = (code *)0x151e9c;
    unlink(mkstemp_req2.path);
    pcStack_228 = (code *)0x151ea4;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_228 = (code *)0x151eac;
    uv_fs_req_cleanup(&mkstemp_req2);
    pcStack_228 = (code *)0x151eb1;
    puVar8 = uv_default_loop();
    pcStack_228 = (code *)0x151ec5;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    pcStack_228 = (code *)0x151ecf;
    uv_run(puVar8,UV_RUN_DEFAULT);
    pcStack_228 = (code *)0x151ed4;
    pcVar7 = (char *)uv_default_loop();
    pcStack_228 = (code *)0x151edc;
    iVar3 = uv_loop_close((uv_loop_t *)pcVar7);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_228 = (code *)0x151ef2;
    run_test_fs_mkstemp_cold_1();
LAB_00151ef2:
    pcStack_228 = (code *)0x151ef7;
    run_test_fs_mkstemp_cold_2();
LAB_00151ef7:
    pcStack_228 = (code *)0x151efc;
    run_test_fs_mkstemp_cold_3();
LAB_00151efc:
    pcStack_228 = (code *)0x151f01;
    run_test_fs_mkstemp_cold_12();
LAB_00151f01:
    pcStack_228 = (code *)0x151f06;
    run_test_fs_mkstemp_cold_4();
LAB_00151f06:
    pcStack_228 = (code *)0x151f0b;
    run_test_fs_mkstemp_cold_5();
LAB_00151f0b:
    pcStack_228 = (code *)0x151f10;
    run_test_fs_mkstemp_cold_6();
LAB_00151f10:
    pcStack_228 = (code *)0x151f15;
    run_test_fs_mkstemp_cold_7();
LAB_00151f15:
    pcStack_228 = (code *)0x151f1a;
    run_test_fs_mkstemp_cold_8();
LAB_00151f1a:
    pcStack_228 = (code *)0x151f1f;
    run_test_fs_mkstemp_cold_9();
LAB_00151f1f:
    pcStack_228 = (code *)0x151f24;
    run_test_fs_mkstemp_cold_10();
  }
  pcStack_228 = mkstemp_cb;
  run_test_fs_mkstemp_cold_11();
  if ((uv_fs_t *)pcVar7 == &mkstemp_req1) {
    puStack_230 = (uv_fs_t *)0x151f42;
    pcStack_228._0_4_ = extraout_EAX_01;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return (int)pcStack_228;
  }
  puStack_230 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  puStack_238 = puVar8;
  puStack_230 = unaff_R14;
  if (((uv_loop_t *)pcVar7)->backend_fd == UV_FS_MKSTEMP) {
    if ((long)((uv_loop_t *)pcVar7)->watcher_queue[0] < 0) goto LAB_00152006;
    puVar14 = (uv_fs_t *)((uv_loop_t *)pcVar7)->watchers;
    if (puVar14 == (uv_fs_t *)0x0) goto LAB_0015200b;
    puStack_248 = (uv_fs_t *)0x151f80;
    sVar6 = strlen((char *)puVar14);
    if (sVar6 != 0x10) goto LAB_00152010;
    if ((short)puVar14->type != 0x5f65 || puVar14->data != (void *)0x6c69665f74736574)
    goto LAB_00152015;
    if (*(short *)&puVar14->field_0xe == 0x5858 && *(int *)((long)&puVar14->type + 2) == 0x58585858)
    goto LAB_0015201a;
    puStack_248 = (uv_fs_t *)0x151fcd;
    check_permission((char *)puVar14,0x180);
    puStack_248 = (uv_fs_t *)0x151fe1;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)((uv_loop_t *)pcVar7)->watchers,
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015201f;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return extraout_EAX_02;
    }
  }
  else {
    puStack_248 = (uv_fs_t *)0x152006;
    check_mkstemp_result_cold_1();
    pcVar7 = (char *)puVar8;
LAB_00152006:
    puStack_248 = (uv_fs_t *)0x15200b;
    check_mkstemp_result_cold_2();
    puVar14 = unaff_R14;
LAB_0015200b:
    puStack_248 = (uv_fs_t *)0x152010;
    check_mkstemp_result_cold_8();
LAB_00152010:
    puStack_248 = (uv_fs_t *)0x152015;
    check_mkstemp_result_cold_3();
LAB_00152015:
    puStack_248 = (uv_fs_t *)0x15201a;
    check_mkstemp_result_cold_4();
LAB_0015201a:
    puStack_248 = (uv_fs_t *)0x15201f;
    check_mkstemp_result_cold_7();
LAB_0015201f:
    puStack_248 = (uv_fs_t *)0x152024;
    check_mkstemp_result_cold_5();
  }
  puStack_248 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  puVar5 = (uv_loop_t *)0x194385;
  p_Stack_4b0 = (uv__io_cb)0x152042;
  puStack_250 = (uv_loop_t *)pcVar7;
  puStack_248 = puVar14;
  unlink("test_file");
  p_Stack_4b0 = (uv__io_cb)0x152047;
  loop = uv_default_loop();
  puVar8 = (uv_loop_t *)0x0;
  p_Stack_4b0 = (uv__io_cb)0x15206e;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_408,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_408.result;
  if (iVar3 < 0) {
    p_Stack_4b0 = (uv__io_cb)0x1523d3;
    run_test_fs_fstat_cold_1();
LAB_001523d3:
    p_Stack_4b0 = (uv__io_cb)0x1523d8;
    run_test_fs_fstat_cold_2();
LAB_001523d8:
    p_Stack_4b0 = (uv__io_cb)0x1523dd;
    run_test_fs_fstat_cold_3();
LAB_001523dd:
    p_Stack_4b0 = (uv__io_cb)0x1523e2;
    run_test_fs_fstat_cold_4();
LAB_001523e2:
    p_Stack_4b0 = (uv__io_cb)0x1523e7;
    run_test_fs_fstat_cold_5();
LAB_001523e7:
    p_Stack_4b0 = (uv__io_cb)0x1523ec;
    run_test_fs_fstat_cold_6();
LAB_001523ec:
    p_Stack_4b0 = (uv__io_cb)0x1523f1;
    run_test_fs_fstat_cold_7();
LAB_001523f1:
    p_Stack_4b0 = (uv__io_cb)0x1523f6;
    run_test_fs_fstat_cold_8();
LAB_001523f6:
    p_Stack_4b0 = (uv__io_cb)0x1523fb;
    run_test_fs_fstat_cold_9();
LAB_001523fb:
    p_Stack_4b0 = (uv__io_cb)0x152400;
    run_test_fs_fstat_cold_10();
LAB_00152400:
    p_Stack_4b0 = (uv__io_cb)0x152405;
    run_test_fs_fstat_cold_11();
LAB_00152405:
    p_Stack_4b0 = (uv__io_cb)0x15240a;
    run_test_fs_fstat_cold_12();
LAB_0015240a:
    p_Stack_4b0 = (uv__io_cb)0x15240f;
    run_test_fs_fstat_cold_13();
LAB_0015240f:
    p_Stack_4b0 = (uv__io_cb)0x152414;
    run_test_fs_fstat_cold_14();
LAB_00152414:
    p_Stack_4b0 = (uv__io_cb)0x152419;
    run_test_fs_fstat_cold_15();
LAB_00152419:
    p_Stack_4b0 = (uv__io_cb)0x15241e;
    run_test_fs_fstat_cold_16();
LAB_0015241e:
    p_Stack_4b0 = (uv__io_cb)0x152423;
    run_test_fs_fstat_cold_17();
LAB_00152423:
    p_Stack_4b0 = (uv__io_cb)0x152428;
    run_test_fs_fstat_cold_18();
LAB_00152428:
    p_Stack_4b0 = (uv__io_cb)0x15242d;
    run_test_fs_fstat_cold_19();
LAB_0015242d:
    p_Stack_4b0 = (uv__io_cb)0x152432;
    run_test_fs_fstat_cold_20();
LAB_00152432:
    p_Stack_4b0 = (uv__io_cb)0x152437;
    run_test_fs_fstat_cold_21();
LAB_00152437:
    p_Stack_4b0 = (uv__io_cb)0x15243c;
    run_test_fs_fstat_cold_22();
LAB_0015243c:
    p_Stack_4b0 = (uv__io_cb)0x152441;
    run_test_fs_fstat_cold_23();
LAB_00152441:
    p_Stack_4b0 = (uv__io_cb)0x152446;
    run_test_fs_fstat_cold_24();
LAB_00152446:
    p_Stack_4b0 = (uv__io_cb)0x15244b;
    run_test_fs_fstat_cold_25();
LAB_0015244b:
    p_Stack_4b0 = (uv__io_cb)0x152450;
    run_test_fs_fstat_cold_26();
LAB_00152450:
    p_Stack_4b0 = (uv__io_cb)0x152455;
    run_test_fs_fstat_cold_27();
LAB_00152455:
    p_Stack_4b0 = (uv__io_cb)0x15245a;
    run_test_fs_fstat_cold_28();
LAB_0015245a:
    p_Stack_4b0 = (uv__io_cb)0x15245f;
    run_test_fs_fstat_cold_29();
LAB_0015245f:
    p_Stack_4b0 = (uv__io_cb)0x152464;
    run_test_fs_fstat_cold_30();
LAB_00152464:
    p_Stack_4b0 = (uv__io_cb)0x152469;
    run_test_fs_fstat_cold_31();
LAB_00152469:
    p_Stack_4b0 = (uv__io_cb)0x15246e;
    run_test_fs_fstat_cold_32();
LAB_0015246e:
    p_Stack_4b0 = (uv__io_cb)0x152473;
    run_test_fs_fstat_cold_33();
LAB_00152473:
    p_Stack_4b0 = (uv__io_cb)0x152478;
    run_test_fs_fstat_cold_34();
LAB_00152478:
    p_Stack_4b0 = (uv__io_cb)0x15247d;
    run_test_fs_fstat_cold_35();
  }
  else {
    puVar5 = (uv_loop_t *)uStack_408.result;
    if (uStack_408.result < 0) goto LAB_001523d3;
    p_Stack_4b0 = (uv__io_cb)0x152094;
    uv_fs_req_cleanup(&uStack_408);
    __fd = (int)sVar2;
    puVar8 = (uv_loop_t *)(sVar2 & 0xffffffff);
    p_Stack_4b0 = (uv__io_cb)0x1520a0;
    iVar3 = fstat64(__fd,&sStack_498);
    puVar5 = (uv_loop_t *)sVar2;
    if (iVar3 != 0) goto LAB_001523d8;
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b0 = (uv__io_cb)0x1520bb;
    iVar3 = uv_fs_fstat((uv_loop_t *)0x0,&uStack_408,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001523dd;
    if ((uv_loop_t *)uStack_408.result != (uv_loop_t *)0x0) goto LAB_001523e2;
    pvVar9 = (void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_gid;
    if ((pvVar9 != (void *)0x0) && (pvVar9 != (void *)sStack_498.st_ctim.tv_sec)) goto LAB_001523e7;
    pvVar9 = (void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_rdev;
    if ((pvVar9 != (void *)0x0) && (pvVar9 != (void *)sStack_498.st_ctim.tv_nsec))
    goto LAB_001523ec;
    p_Stack_4b0 = (uv__io_cb)0x15211c;
    uVar17 = uv_buf_init(test_buf,0xd);
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b0 = (uv__io_cb)0x152157;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&uStack_408,__fd,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 != 0xd) goto LAB_001523f1;
    if ((uv_loop_t *)uStack_408.result != (uv_loop_t *)0xd) goto LAB_001523f6;
    puVar14 = &uStack_408;
    p_Stack_4b0 = (uv__io_cb)0x15217f;
    uv_fs_req_cleanup(puVar14);
    p_Stack_4b0 = (uv__io_cb)0x152196;
    memset(&uStack_408.statbuf,0xaa,0xa0);
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b0 = (uv__io_cb)0x1521a4;
    iVar3 = uv_fs_fstat((uv_loop_t *)0x0,puVar14,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001523fb;
    if ((uv_loop_t *)uStack_408.result != (uv_loop_t *)0x0) goto LAB_00152400;
    puVar14 = (uv_fs_t *)uStack_408.ptr;
    if (((void **)((long)uStack_408.ptr + 0x10))[5] != (void *)0xd) goto LAB_00152405;
    puVar8 = (uv_loop_t *)(sVar2 & 0xffffffff);
    p_Stack_4b0 = (uv__io_cb)0x1521da;
    iVar3 = fstat64(__fd,&sStack_498);
    if (iVar3 != 0) goto LAB_0015240a;
    if (*(void **)uStack_408.ptr != (void *)sStack_498.st_dev) goto LAB_0015240f;
    if (*(ulong *)((long)uStack_408.ptr + 8) != (ulong)sStack_498.st_mode) goto LAB_00152414;
    if (*(void **)((long)uStack_408.ptr + 0x10) != (void *)sStack_498.st_nlink) goto LAB_00152419;
    if (((void **)((long)uStack_408.ptr + 0x10))[1] != (void *)(ulong)sStack_498.st_uid)
    goto LAB_0015241e;
    if (((void **)((long)uStack_408.ptr + 0x10))[2] != (void *)(ulong)sStack_498.st_gid)
    goto LAB_00152423;
    if (((void **)((long)uStack_408.ptr + 0x10))[3] != (void *)sStack_498.st_rdev)
    goto LAB_00152428;
    if (((void **)((long)uStack_408.ptr + 0x10))[4] != (void *)sStack_498.st_ino) goto LAB_0015242d;
    if (((void **)((long)uStack_408.ptr + 0x10))[5] != (void *)sStack_498.st_size)
    goto LAB_00152432;
    if (*(uint64_t *)((long)uStack_408.ptr + 0x40) != sStack_498.st_blksize) goto LAB_00152437;
    if (*(uv_loop_t **)((long)uStack_408.ptr + 0x48) != (uv_loop_t *)sStack_498.st_blocks)
    goto LAB_0015243c;
    if (*(int (*) [2])((long)uStack_408.ptr + 0x60) != (int  [2])sStack_498.st_atim.tv_sec)
    goto LAB_00152441;
    if (*(uv__io_cb *)((long)uStack_408.ptr + 0x68) != (uv__io_cb)sStack_498.st_atim.tv_nsec)
    goto LAB_00152446;
    if ((void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_dev !=
        (void *)sStack_498.st_mtim.tv_sec) goto LAB_0015244b;
    if ((void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_mode !=
        (void *)sStack_498.st_mtim.tv_nsec) goto LAB_00152450;
    if ((void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_nlink !=
        (void *)sStack_498.st_ctim.tv_sec) goto LAB_00152455;
    if ((void *)((uv_stat_t *)((long)uStack_408.ptr + 0x70))->st_uid !=
        (void *)sStack_498.st_ctim.tv_nsec) goto LAB_0015245a;
    if (*(uv_fs_cb *)((long)uStack_408.ptr + 0x50) != (uv_fs_cb)0x0) goto LAB_0015245f;
    if (*(ssize_t *)((long)uStack_408.ptr + 0x58) != 0) goto LAB_00152464;
    puVar14 = &uStack_408;
    p_Stack_4b0 = (uv__io_cb)0x1522fd;
    uv_fs_req_cleanup(puVar14);
    p_Stack_4b0 = (uv__io_cb)0x152315;
    puVar8 = loop;
    iVar3 = uv_fs_fstat(loop,puVar14,__fd,fstat_cb);
    if (iVar3 != 0) goto LAB_00152469;
    p_Stack_4b0 = (uv__io_cb)0x15232b;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fstat_cb_count != 1) goto LAB_0015246e;
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b0 = (uv__io_cb)0x15234b;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_408,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152473;
    if ((uv_loop_t *)uStack_408.result != (uv_loop_t *)0x0) goto LAB_00152478;
    p_Stack_4b0 = (uv__io_cb)0x15236f;
    uv_fs_req_cleanup(&uStack_408);
    p_Stack_4b0 = (uv__io_cb)0x15237d;
    uv_run(loop,UV_RUN_DEFAULT);
    p_Stack_4b0 = (uv__io_cb)0x152389;
    unlink("test_file");
    p_Stack_4b0 = (uv__io_cb)0x15238e;
    puVar5 = uv_default_loop();
    p_Stack_4b0 = (uv__io_cb)0x1523a2;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    p_Stack_4b0 = (uv__io_cb)0x1523ac;
    uv_run(puVar5,UV_RUN_DEFAULT);
    p_Stack_4b0 = (uv__io_cb)0x1523b1;
    puVar8 = uv_default_loop();
    p_Stack_4b0 = (uv__io_cb)0x1523b9;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  p_Stack_4b0 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar8->backend_fd == 8) {
    if (puVar8->watcher_queue[0] != (void *)0x0) goto LAB_001524ad;
    if (*(long *)((long)puVar8->watcher_queue[1] + 0x38) == 0xd) {
      puStack_4b8 = (uv_fs_t *)0x1524a0;
      p_Stack_4b0._0_4_ = extraout_EAX_03;
      uv_fs_req_cleanup((uv_fs_t *)puVar8);
      fstat_cb_count = fstat_cb_count + 1;
      return (int)p_Stack_4b0;
    }
  }
  else {
    puStack_4b8 = (uv_fs_t *)0x1524ad;
    fstat_cb_cold_1();
LAB_001524ad:
    puStack_4b8 = (uv_fs_t *)0x1524b2;
    fstat_cb_cold_2();
  }
  puStack_4b8 = (uv_fs_t *)run_test_fs_access;
  fstat_cb_cold_3();
  req = &uStack_678;
  puVar8 = (uv_loop_t *)&uStack_678;
  puVar11 = (uv_loop_t *)0x194385;
  puStack_4c0 = puVar5;
  puStack_4b8 = puVar14;
  unlink("test_file");
  rmdir("test_dir");
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_678,"test_file",0,(uv_fs_cb)0x0);
  if (iVar3 < 0) {
    if (-1 < uStack_678.result) goto LAB_00152720;
    uv_fs_req_cleanup(&uStack_678);
    puVar5 = loop;
    iVar3 = uv_fs_access(loop,&uStack_678,"test_file",0,access_cb);
    puVar11 = (uv_loop_t *)&uStack_678;
    if (iVar3 != 0) goto LAB_00152725;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar11 = (uv_loop_t *)&uStack_678;
    if (access_cb_count != 1) goto LAB_0015272a;
    access_cb_count = 0;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_678,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    puVar12 = (uv_loop_t *)uStack_678.result;
    puVar11 = (uv_loop_t *)&uStack_678;
    if (iVar3 < 0) goto LAB_0015272f;
    if (uStack_678.result < 0) goto LAB_00152734;
    uv_fs_req_cleanup(&uStack_678);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_678,"test_file",0,(uv_fs_cb)0x0);
    puVar14 = &uStack_678;
    if (iVar3 != 0) goto LAB_00152739;
    puVar14 = &uStack_678;
    if ((uv_loop_t *)uStack_678.result != (uv_loop_t *)0x0) goto LAB_0015273e;
    uv_fs_req_cleanup(&uStack_678);
    puVar5 = loop;
    iVar3 = uv_fs_access(loop,&uStack_678,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_00152743;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    req = &uStack_678;
    if (access_cb_count != 1) goto LAB_00152748;
    access_cb_count = 0;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_678,(uv_file)puVar12,(uv_fs_cb)0x0);
    req = &uStack_678;
    if (iVar3 != 0) goto LAB_0015274d;
    req = &uStack_678;
    if ((uv_loop_t *)uStack_678.result != (uv_loop_t *)0x0) goto LAB_00152752;
    uv_fs_req_cleanup(&uStack_678);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir((uv_loop_t *)0x0,&uStack_678,"test_dir",0x1ff,(uv_fs_cb)0x0);
    puVar12 = (uv_loop_t *)&uStack_678;
    req = &uStack_678;
    if (iVar3 != 0) goto LAB_00152757;
    uv_fs_req_cleanup(&uStack_678);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_678,"test_dir",2,(uv_fs_cb)0x0);
    req = &uStack_678;
    if (iVar3 != 0) goto LAB_0015275c;
    puVar8 = (uv_loop_t *)&uStack_678;
    req = &uStack_678;
    if ((uv_loop_t *)uStack_678.result != (uv_loop_t *)0x0) goto LAB_00152761;
    uv_fs_req_cleanup(&uStack_678);
    uv_run(loop,UV_RUN_DEFAULT);
    unlink("test_file");
    rmdir("test_dir");
    puVar8 = uv_default_loop();
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    uv_run(puVar8,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar3 = uv_loop_close(puVar5);
    req = &uStack_678;
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00152720:
    run_test_fs_access_cold_2();
LAB_00152725:
    run_test_fs_access_cold_3();
LAB_0015272a:
    run_test_fs_access_cold_4();
LAB_0015272f:
    puVar12 = puVar11;
    run_test_fs_access_cold_5();
LAB_00152734:
    run_test_fs_access_cold_6();
LAB_00152739:
    run_test_fs_access_cold_7();
LAB_0015273e:
    req = puVar14;
    run_test_fs_access_cold_8();
LAB_00152743:
    run_test_fs_access_cold_9();
LAB_00152748:
    run_test_fs_access_cold_10();
LAB_0015274d:
    run_test_fs_access_cold_11();
LAB_00152752:
    run_test_fs_access_cold_12();
LAB_00152757:
    puVar8 = puVar12;
    run_test_fs_access_cold_13();
LAB_0015275c:
    run_test_fs_access_cold_14();
LAB_00152761:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar5->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    return extraout_EAX_04;
  }
  access_cb_cold_1();
  puVar5 = (uv_loop_t *)0x194385;
  puStack_860 = (uv_loop_t *)0x15279d;
  puStack_698 = puVar8;
  puStack_690 = req;
  unlink("test_file");
  puStack_860 = (uv_loop_t *)0x1527a2;
  loop = uv_default_loop();
  puVar14 = &uStack_850;
  puVar8 = (uv_loop_t *)0x0;
  puStack_860 = (uv_loop_t *)0x1527c6;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,puVar14,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_850.result;
  if (iVar3 < 0) {
    puStack_860 = (uv_loop_t *)0x152a99;
    run_test_fs_chmod_cold_1();
LAB_00152a99:
    puStack_860 = (uv_loop_t *)0x152a9e;
    run_test_fs_chmod_cold_2();
LAB_00152a9e:
    puStack_860 = (uv_loop_t *)0x152aa3;
    run_test_fs_chmod_cold_3();
LAB_00152aa3:
    puStack_860 = (uv_loop_t *)0x152aa8;
    run_test_fs_chmod_cold_4();
LAB_00152aa8:
    puStack_860 = (uv_loop_t *)0x152aad;
    run_test_fs_chmod_cold_5();
LAB_00152aad:
    puStack_860 = (uv_loop_t *)0x152ab2;
    run_test_fs_chmod_cold_6();
LAB_00152ab2:
    puStack_860 = (uv_loop_t *)0x152ab7;
    run_test_fs_chmod_cold_7();
LAB_00152ab7:
    puStack_860 = (uv_loop_t *)0x152abc;
    run_test_fs_chmod_cold_8();
LAB_00152abc:
    puStack_860 = (uv_loop_t *)0x152ac1;
    run_test_fs_chmod_cold_9();
LAB_00152ac1:
    puStack_860 = (uv_loop_t *)0x152ac6;
    run_test_fs_chmod_cold_10();
LAB_00152ac6:
    puStack_860 = (uv_loop_t *)0x152acb;
    run_test_fs_chmod_cold_11();
LAB_00152acb:
    puStack_860 = (uv_loop_t *)0x152ad0;
    run_test_fs_chmod_cold_12();
LAB_00152ad0:
    puStack_860 = (uv_loop_t *)0x152ad5;
    run_test_fs_chmod_cold_13();
LAB_00152ad5:
    puStack_860 = (uv_loop_t *)0x152ada;
    run_test_fs_chmod_cold_14();
LAB_00152ada:
    puStack_860 = (uv_loop_t *)0x152adf;
    run_test_fs_chmod_cold_15();
LAB_00152adf:
    puStack_860 = (uv_loop_t *)0x152ae4;
    run_test_fs_chmod_cold_16();
  }
  else {
    puVar5 = (uv_loop_t *)uStack_850.result;
    if (uStack_850.result < 0) goto LAB_00152a99;
    req = &uStack_850;
    puStack_860 = (uv_loop_t *)0x1527e9;
    uv_fs_req_cleanup(req);
    puStack_860 = (uv_loop_t *)0x1527fa;
    uVar17 = uv_buf_init(test_buf,0xd);
    puVar8 = (uv_loop_t *)0x0;
    uVar10 = (uv_file)sVar2;
    puStack_860 = (uv_loop_t *)0x152830;
    puVar14 = req;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req,uVar10,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_00152a9e;
    if ((uv_loop_t *)uStack_850.result != (uv_loop_t *)0xd) goto LAB_00152aa3;
    req = &uStack_850;
    puStack_860 = (uv_loop_t *)0x152852;
    uv_fs_req_cleanup(req);
    puVar8 = (uv_loop_t *)0x0;
    puStack_860 = (uv_loop_t *)0x15286b;
    puVar14 = req;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req,"test_file",0x80,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152aa8;
    if ((uv_loop_t *)uStack_850.result != (uv_loop_t *)0x0) goto LAB_00152aad;
    req = &uStack_850;
    puStack_860 = (uv_loop_t *)0x15288c;
    uv_fs_req_cleanup(req);
    puStack_860 = (uv_loop_t *)0x1528a0;
    check_permission("test_file",0x80);
    puVar8 = (uv_loop_t *)0x0;
    puStack_860 = (uv_loop_t *)0x1528b5;
    puVar14 = req;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152ab2;
    if ((uv_loop_t *)uStack_850.result != (uv_loop_t *)0x0) goto LAB_00152ab7;
    req = &uStack_850;
    puStack_860 = (uv_loop_t *)0x1528d6;
    uv_fs_req_cleanup(req);
    puStack_860 = (uv_loop_t *)0x1528e7;
    check_permission("test_file",0x100);
    puVar8 = (uv_loop_t *)0x0;
    puStack_860 = (uv_loop_t *)0x1528fb;
    puVar14 = req;
    iVar3 = uv_fs_fchmod((uv_loop_t *)0x0,req,uVar10,0x180,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152abc;
    if ((uv_loop_t *)uStack_850.result != (uv_loop_t *)0x0) goto LAB_00152ac1;
    req = &uStack_850;
    puStack_860 = (uv_loop_t *)0x15291c;
    uv_fs_req_cleanup(req);
    puStack_860 = (uv_loop_t *)0x152930;
    check_permission("test_file",0x180);
    uStack_850.data = &run_test_fs_chmod::mode;
    puStack_860 = (uv_loop_t *)0x152958;
    puVar14 = req;
    puVar8 = loop;
    iVar3 = uv_fs_chmod(loop,req,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_00152ac6;
    puVar14 = (uv_fs_t *)0x0;
    puStack_860 = (uv_loop_t *)0x15296e;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_00152acb;
    chmod_cb_count = 0;
    puVar14 = &uStack_850;
    uStack_850.data = &run_test_fs_chmod::mode_1;
    puStack_860 = (uv_loop_t *)0x1529b3;
    puVar8 = loop;
    iVar3 = uv_fs_chmod(loop,puVar14,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_00152ad0;
    puVar14 = (uv_fs_t *)0x0;
    puStack_860 = (uv_loop_t *)0x1529c9;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_00152ad5;
    puVar14 = &uStack_850;
    uStack_850.data = &run_test_fs_chmod::mode_2;
    puStack_860 = (uv_loop_t *)0x1529ff;
    puVar8 = loop;
    iVar3 = uv_fs_fchmod(loop,puVar14,uVar10,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_00152ada;
    puVar14 = (uv_fs_t *)0x0;
    puStack_860 = (uv_loop_t *)0x152a15;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fchmod_cb_count != 1) goto LAB_00152adf;
    puStack_860 = (uv_loop_t *)0x152a37;
    uv_fs_close(loop,&uStack_850,uVar10,(uv_fs_cb)0x0);
    puStack_860 = (uv_loop_t *)0x152a45;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_860 = (uv_loop_t *)0x152a51;
    unlink("test_file");
    puStack_860 = (uv_loop_t *)0x152a56;
    puVar5 = uv_default_loop();
    puStack_860 = (uv_loop_t *)0x152a6a;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puVar14 = (uv_fs_t *)0x0;
    puStack_860 = (uv_loop_t *)0x152a74;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_860 = (uv_loop_t *)0x152a79;
    puVar8 = uv_default_loop();
    puStack_860 = (uv_loop_t *)0x152a81;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_860 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_17();
  puVar13 = (uv_fs_t *)((ulong)puVar14 & 0xffffffff);
  puVar15 = (uv_fs_t *)0x0;
  auStack_bf8._464_8_ = (void *)0x152b04;
  puStack_860 = puVar5;
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(auStack_bf8 + 0x1e0),(char *)puVar8,(uv_fs_cb)0x0)
  ;
  if (iVar3 == 0) {
    if (pvStack_9c0 != (void *)0x0) goto LAB_00152b38;
    if ((uStack_9a0 & 0x1ff) == (uint)puVar14) {
      auStack_bf8._464_8_ = (void *)0x152b2a;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_bf8 + 0x1e0));
      return extraout_EAX_05;
    }
  }
  else {
    auStack_bf8._464_8_ = (void *)0x152b38;
    check_permission_cold_1();
LAB_00152b38:
    auStack_bf8._464_8_ = (void *)0x152b3d;
    check_permission_cold_2();
  }
  auStack_bf8._464_8_ = chmod_cb;
  check_permission_cold_3();
  auStack_bf8._464_8_ = puVar13;
  if (puVar15->fs_type == UV_FS_CHMOD) {
    puVar13 = puVar15;
    if (puVar15->result == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_bf8._456_8_ = (uv__io_cb)0x152b61;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*puVar15->data);
      return extraout_EAX_06;
    }
  }
  else {
    auStack_bf8._456_8_ = (uv__io_cb)0x152b78;
    chmod_cb_cold_1();
  }
  auStack_bf8._456_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_bf8._456_8_ = puVar13;
  if (puVar15->fs_type == UV_FS_FCHMOD) {
    auStack_bf8._440_8_ = puVar15;
    if (puVar15->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_bf8._448_8_ = (_func_void *)0x152b9c;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*puVar15->data);
      return extraout_EAX_07;
    }
  }
  else {
    auStack_bf8._448_8_ = (_func_void *)0x152bb3;
    fchmod_cb_cold_1();
    auStack_bf8._440_8_ = puVar13;
  }
  auStack_bf8._448_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194385;
  puStack_c10 = (uv_fs_t *)0x152bd1;
  auStack_bf8._448_8_ = req;
  unlink("test_file");
  puStack_c10 = (uv_fs_t *)0x152bd6;
  loop = uv_default_loop();
  puStack_c10 = (uv_fs_t *)0x152bfa;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_bf8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_bf8._88_8_;
  if (iVar3 < 0) {
    puStack_c10 = (uv_fs_t *)0x152d97;
    run_test_fs_unlink_readonly_cold_1();
LAB_00152d97:
    puStack_c10 = (uv_fs_t *)0x152d9c;
    run_test_fs_unlink_readonly_cold_2();
LAB_00152d9c:
    puStack_c10 = (uv_fs_t *)0x152da1;
    run_test_fs_unlink_readonly_cold_3();
LAB_00152da1:
    puStack_c10 = (uv_fs_t *)0x152da6;
    run_test_fs_unlink_readonly_cold_4();
LAB_00152da6:
    puStack_c10 = (uv_fs_t *)0x152dab;
    run_test_fs_unlink_readonly_cold_5();
LAB_00152dab:
    puStack_c10 = (uv_fs_t *)0x152db0;
    run_test_fs_unlink_readonly_cold_6();
LAB_00152db0:
    puStack_c10 = (uv_fs_t *)0x152db5;
    run_test_fs_unlink_readonly_cold_7();
LAB_00152db5:
    puStack_c10 = (uv_fs_t *)0x152dba;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_bf8._88_8_;
    if ((long)auStack_bf8._88_8_ < 0) goto LAB_00152d97;
    req = (uv_fs_t *)auStack_bf8;
    puStack_c10 = (uv_fs_t *)0x152c1d;
    uv_fs_req_cleanup(req);
    puStack_c10 = (uv_fs_t *)0x152c2e;
    uVar17 = uv_buf_init(test_buf,0xd);
    puStack_c10 = (uv_fs_t *)0x152c64;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req,(uv_file)uVar1,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00152d9c;
    if ((uv_loop_t *)auStack_bf8._88_8_ != (uv_loop_t *)0xd) goto LAB_00152da1;
    req = (uv_fs_t *)auStack_bf8;
    puStack_c10 = (uv_fs_t *)0x152c86;
    uv_fs_req_cleanup(req);
    puStack_c10 = (uv_fs_t *)0x152c99;
    uv_fs_close(loop,req,(uv_file)uVar1,(uv_fs_cb)0x0);
    puStack_c10 = (uv_fs_t *)0x152cb2;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152da6;
    if ((uv_loop_t *)auStack_bf8._88_8_ != (uv_loop_t *)0x0) goto LAB_00152dab;
    puVar5 = (uv_loop_t *)auStack_bf8;
    puStack_c10 = (uv_fs_t *)0x152cd3;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    req = (uv_fs_t *)0x194385;
    puStack_c10 = (uv_fs_t *)0x152ce7;
    check_permission("test_file",0x100);
    puStack_c10 = (uv_fs_t *)0x152cf6;
    iVar3 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar5,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152db0;
    if ((uv_loop_t *)auStack_bf8._88_8_ != (uv_loop_t *)0x0) goto LAB_00152db5;
    puStack_c10 = (uv_fs_t *)0x152d17;
    uv_fs_req_cleanup((uv_fs_t *)auStack_bf8);
    puStack_c10 = (uv_fs_t *)0x152d25;
    uv_run(loop,UV_RUN_DEFAULT);
    req = (uv_fs_t *)0x194385;
    puStack_c10 = (uv_fs_t *)0x152d41;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_bf8,"test_file",0x180,(uv_fs_cb)0x0);
    puStack_c10 = (uv_fs_t *)0x152d49;
    uv_fs_req_cleanup((uv_fs_t *)auStack_bf8);
    puStack_c10 = (uv_fs_t *)0x152d51;
    unlink("test_file");
    puStack_c10 = (uv_fs_t *)0x152d56;
    puVar5 = uv_default_loop();
    puStack_c10 = (uv_fs_t *)0x152d6a;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_c10 = (uv_fs_t *)0x152d74;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_c10 = (uv_fs_t *)0x152d79;
    puVar8 = uv_default_loop();
    puStack_c10 = (uv_fs_t *)0x152d81;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_c10 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar16 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
  puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
  puVar13 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
  puVar14 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
  puVar8 = (uv_loop_t *)0x194385;
  auStack_fb8._480_8_ = (void *)0x152dd8;
  puStack_c18 = puVar5;
  puStack_c10 = req;
  unlink("test_file");
  auStack_fb8._480_8_ = (void *)0x152de4;
  unlink("test_file_link");
  auStack_fb8._480_8_ = (void *)0x152de9;
  loop = uv_default_loop();
  puVar11 = (uv_loop_t *)0x0;
  auStack_fb8._480_8_ = (void *)0x152e0b;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar5 = puStack_d78;
  if (iVar3 < 0) {
    auStack_fb8._480_8_ = (void *)0x1530dc;
    run_test_fs_chown_cold_1();
LAB_001530dc:
    auStack_fb8._480_8_ = (void *)0x1530e1;
    run_test_fs_chown_cold_2();
LAB_001530e1:
    auStack_fb8._480_8_ = (void *)0x1530e6;
    run_test_fs_chown_cold_3();
LAB_001530e6:
    puVar16 = req;
    auStack_fb8._480_8_ = (void *)0x1530eb;
    run_test_fs_chown_cold_4();
LAB_001530eb:
    auStack_fb8._480_8_ = (void *)0x1530f0;
    run_test_fs_chown_cold_5();
LAB_001530f0:
    puVar15 = puVar16;
    auStack_fb8._480_8_ = (void *)0x1530f5;
    run_test_fs_chown_cold_6();
LAB_001530f5:
    auStack_fb8._480_8_ = (void *)0x1530fa;
    run_test_fs_chown_cold_7();
LAB_001530fa:
    auStack_fb8._480_8_ = (void *)0x1530ff;
    run_test_fs_chown_cold_8();
LAB_001530ff:
    auStack_fb8._480_8_ = (void *)0x153104;
    run_test_fs_chown_cold_9();
LAB_00153104:
    auStack_fb8._480_8_ = (void *)0x153109;
    run_test_fs_chown_cold_10();
LAB_00153109:
    auStack_fb8._480_8_ = (void *)0x15310e;
    run_test_fs_chown_cold_11();
LAB_0015310e:
    auStack_fb8._480_8_ = (void *)0x153113;
    run_test_fs_chown_cold_12();
LAB_00153113:
    auStack_fb8._480_8_ = (void *)0x153118;
    run_test_fs_chown_cold_13();
LAB_00153118:
    puVar13 = puVar15;
    auStack_fb8._480_8_ = (void *)0x15311d;
    run_test_fs_chown_cold_14();
LAB_0015311d:
    auStack_fb8._480_8_ = (void *)0x153122;
    run_test_fs_chown_cold_15();
LAB_00153122:
    puVar14 = puVar13;
    auStack_fb8._480_8_ = (void *)0x153127;
    run_test_fs_chown_cold_16();
LAB_00153127:
    auStack_fb8._480_8_ = (void *)0x15312c;
    run_test_fs_chown_cold_17();
LAB_0015312c:
    auStack_fb8._480_8_ = (void *)0x153131;
    run_test_fs_chown_cold_18();
LAB_00153131:
    auStack_fb8._480_8_ = (void *)0x153136;
    run_test_fs_chown_cold_19();
LAB_00153136:
    auStack_fb8._480_8_ = (void *)0x15313b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar8 = puStack_d78;
    if ((long)puStack_d78 < 0) goto LAB_001530dc;
    auStack_fb8._480_8_ = (void *)0x152e2c;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    puVar11 = (uv_loop_t *)0x0;
    auStack_fb8._480_8_ = (void *)0x152e4b;
    iVar3 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar8 = puVar5;
    req = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530e1;
    req = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (puStack_d78 != (uv_loop_t *)0x0) goto LAB_001530e6;
    auStack_fb8._480_8_ = (void *)0x152e6a;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    puVar11 = (uv_loop_t *)0x0;
    uVar10 = (uv_file)puVar5;
    auStack_fb8._480_8_ = (void *)0x152e84;
    iVar3 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),uVar10,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001530eb;
    puVar16 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (puStack_d78 != (uv_loop_t *)0x0) goto LAB_001530f0;
    auStack_fb8._480_8_ = (void *)0x152ea3;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    auStack_fb8._480_8_ = (void *)0x152ecb;
    puVar11 = loop;
    iVar3 = uv_fs_chown(loop,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar3 != 0) goto LAB_001530f5;
    auStack_fb8._480_8_ = (void *)0x152ee1;
    puVar11 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_001530fa;
    chown_cb_count = 0;
    auStack_fb8._480_8_ = (void *)0x152f1a;
    puVar11 = loop;
    iVar3 = uv_fs_chown(loop,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file",0,0,chown_root_cb);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530ff;
    auStack_fb8._480_8_ = (void *)0x152f30;
    puVar11 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00153104;
    auStack_fb8._480_8_ = (void *)0x152f60;
    puVar11 = loop;
    iVar3 = uv_fs_fchown(loop,(uv_fs_t *)(auStack_fb8 + 0x1e8),uVar10,0xffffffff,0xffffffff,
                         fchown_cb);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153109;
    auStack_fb8._480_8_ = (void *)0x152f76;
    puVar11 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_0015310e;
    puVar11 = (uv_loop_t *)0x0;
    auStack_fb8._480_8_ = (void *)0x152f9e;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153113;
    puVar15 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (puStack_d78 != (uv_loop_t *)0x0) goto LAB_00153118;
    auStack_fb8._480_8_ = (void *)0x152fbd;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    puVar11 = (uv_loop_t *)0x0;
    auStack_fb8._480_8_ = (void *)0x152fdc;
    iVar3 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015311d;
    puVar13 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (puStack_d78 != (uv_loop_t *)0x0) goto LAB_00153122;
    auStack_fb8._480_8_ = (void *)0x152ffb;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    auStack_fb8._480_8_ = (void *)0x153023;
    puVar11 = loop;
    iVar3 = uv_fs_lchown(loop,(uv_fs_t *)(auStack_fb8 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_00153127;
    auStack_fb8._480_8_ = (void *)0x153039;
    puVar11 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar14 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_0015312c;
    puVar11 = (uv_loop_t *)0x0;
    auStack_fb8._480_8_ = (void *)0x153054;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fb8 + 0x1e8),uVar10,(uv_fs_cb)0x0);
    puVar14 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153131;
    puVar14 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (puStack_d78 != (uv_loop_t *)0x0) goto LAB_00153136;
    auStack_fb8._480_8_ = (void *)0x153070;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fb8 + 0x1e8));
    auStack_fb8._480_8_ = (void *)0x15307e;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_fb8._480_8_ = (void *)0x15308a;
    unlink("test_file");
    auStack_fb8._480_8_ = (void *)0x153096;
    unlink("test_file_link");
    auStack_fb8._480_8_ = (void *)0x15309b;
    puVar8 = uv_default_loop();
    auStack_fb8._480_8_ = (void *)0x1530af;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    auStack_fb8._480_8_ = (void *)0x1530b9;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStack_fb8._480_8_ = (void *)0x1530be;
    puVar11 = uv_default_loop();
    auStack_fb8._480_8_ = (void *)0x1530c6;
    iVar3 = uv_loop_close(puVar11);
    puVar14 = (uv_fs_t *)(auStack_fb8 + 0x1e8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  auStack_fb8._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar11->backend_fd == 0x1a) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar11);
      return extraout_EAX_08;
    }
  }
  else {
    auStack_fb8._472_8_ = (void *)0x15315f;
    chown_cb_cold_1();
  }
  auStack_fb8._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_fb8._472_8_ = puVar8;
  if (puVar11->backend_fd == 0x1a) {
    auStack_fb8._464_8_ = (void *)0x153173;
    puVar5 = puVar11;
    _Var4 = geteuid();
    pvVar9 = puVar11->watcher_queue[0];
    if (_Var4 != 0) {
      if (pvVar9 == (void *)0xffffffffffffffff) goto LAB_0015318b;
      auStack_fb8._464_8_ = (void *)0x153186;
      chown_root_cb_cold_2();
    }
    puVar8 = puVar11;
    if (pvVar9 == (void *)0x0) {
LAB_0015318b:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar11);
      return extraout_EAX_09;
    }
  }
  else {
    auStack_fb8._464_8_ = (void *)0x15319f;
    chown_root_cb_cold_1();
    puVar5 = puVar11;
  }
  auStack_fb8._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar5->backend_fd == 0x1b) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_10;
    }
  }
  else {
    auStack_fb8._456_8_ = (uv__io_cb)0x1531c3;
    fchown_cb_cold_1();
  }
  auStack_fb8._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (puVar5->backend_fd == 0x1e) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_11;
    }
  }
  else {
    auStack_fb8._448_8_ = (_func_void *)0x1531e7;
    lchown_cb_cold_1();
  }
  auStack_fb8._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194385;
  pcStackY_fd0 = (code *)0x153205;
  auStack_fb8._440_8_ = puVar8;
  auStack_fb8._448_8_ = puVar14;
  unlink("test_file");
  pcStackY_fd0 = (code *)0x153211;
  unlink("test_file_link");
  pcStackY_fd0 = (code *)0x15321d;
  unlink("test_file_link2");
  pcStackY_fd0 = (code *)0x153222;
  loop = uv_default_loop();
  pcVar7 = (char *)0x0;
  pcStackY_fd0 = (code *)0x153246;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_fb8._88_8_;
  if (iVar3 < 0) {
    pcStackY_fd0 = (code *)0x153584;
    run_test_fs_link_cold_1();
LAB_00153584:
    pcStackY_fd0 = (code *)0x153589;
    run_test_fs_link_cold_2();
LAB_00153589:
    pcStackY_fd0 = (code *)0x15358e;
    run_test_fs_link_cold_3();
LAB_0015358e:
    pcStackY_fd0 = (code *)0x153593;
    run_test_fs_link_cold_4();
LAB_00153593:
    pcStackY_fd0 = (code *)0x153598;
    run_test_fs_link_cold_5();
LAB_00153598:
    pcStackY_fd0 = (code *)0x15359d;
    run_test_fs_link_cold_6();
LAB_0015359d:
    puVar8 = puVar5;
    pcStackY_fd0 = (code *)0x1535a2;
    run_test_fs_link_cold_7();
LAB_001535a2:
    pcStackY_fd0 = (code *)0x1535a7;
    run_test_fs_link_cold_8();
LAB_001535a7:
    pcStackY_fd0 = (code *)0x1535ac;
    run_test_fs_link_cold_9();
LAB_001535ac:
    pcStackY_fd0 = (code *)0x1535b1;
    run_test_fs_link_cold_10();
LAB_001535b1:
    pcStackY_fd0 = (code *)0x1535b6;
    run_test_fs_link_cold_11();
LAB_001535b6:
    pcStackY_fd0 = (code *)0x1535bb;
    run_test_fs_link_cold_12();
LAB_001535bb:
    pcStackY_fd0 = (code *)0x1535c0;
    run_test_fs_link_cold_13();
LAB_001535c0:
    puVar5 = puVar8;
    pcStackY_fd0 = (code *)0x1535c5;
    run_test_fs_link_cold_14();
LAB_001535c5:
    pcStackY_fd0 = (code *)0x1535ca;
    run_test_fs_link_cold_15();
LAB_001535ca:
    pcStackY_fd0 = (code *)0x1535cf;
    run_test_fs_link_cold_16();
LAB_001535cf:
    pcStackY_fd0 = (code *)0x1535d4;
    run_test_fs_link_cold_17();
LAB_001535d4:
    pcStackY_fd0 = (code *)0x1535d9;
    run_test_fs_link_cold_18();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_fb8._88_8_;
    if ((long)auStack_fb8._88_8_ < 0) goto LAB_00153584;
    pcStackY_fd0 = (code *)0x153269;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fb8);
    pcStackY_fd0 = (code *)0x15327a;
    uVar17 = uv_buf_init(test_buf,0xd);
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x1532b0;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00153589;
    if ((uv_loop_t *)auStack_fb8._88_8_ != (uv_loop_t *)0xd) goto LAB_0015358e;
    pcStackY_fd0 = (code *)0x1532d2;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fb8);
    pcStackY_fd0 = (code *)0x1532e5;
    uv_fs_close(loop,(uv_fs_t *)auStack_fb8,(uv_file)uVar1,(uv_fs_cb)0x0);
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x153300;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00153593;
    if ((uv_loop_t *)auStack_fb8._88_8_ != (uv_loop_t *)0x0) goto LAB_00153598;
    pcStackY_fd0 = (code *)0x153321;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fb8);
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x15333d;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar8 = (uv_loop_t *)auStack_fb8._88_8_;
    puVar5 = (uv_loop_t *)auStack_fb8;
    if (iVar3 < 0) goto LAB_0015359d;
    if ((long)auStack_fb8._88_8_ < 0) goto LAB_001535a2;
    pcStackY_fd0 = (code *)0x153360;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fb8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_fd0 = (code *)0x153382;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x1533b4;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,(uv_file)puVar8,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535a7;
    if ((long)auStack_fb8._88_8_ < 0) goto LAB_001535ac;
    pcVar7 = buf;
    pcStackY_fd0 = (code *)0x1533db;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535b1;
    pcStackY_fd0 = (code *)0x1533ea;
    close((uv_file)puVar8);
    pcStackY_fd0 = (code *)0x153410;
    pcVar7 = (char *)loop;
    iVar3 = uv_fs_link(loop,(uv_fs_t *)auStack_fb8,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_001535b6;
    pcStackY_fd0 = (code *)0x153426;
    pcVar7 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001535bb;
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x153451;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)auStack_fb8._88_8_;
    if (iVar3 < 0) goto LAB_001535c0;
    if ((long)auStack_fb8._88_8_ < 0) goto LAB_001535c5;
    pcStackY_fd0 = (code *)0x153474;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fb8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_fd0 = (code *)0x153496;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar7 = (char *)0x0;
    pcStackY_fd0 = (code *)0x1534c8;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_fb8,(uv_file)puVar5,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535ca;
    if ((long)auStack_fb8._88_8_ < 0) goto LAB_001535cf;
    pcVar7 = buf;
    pcStackY_fd0 = (code *)0x1534ef;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535d4;
    pcStackY_fd0 = (code *)0x15350c;
    uv_fs_close(loop,(uv_fs_t *)auStack_fb8,(uv_file)puVar5,(uv_fs_cb)0x0);
    pcStackY_fd0 = (code *)0x15351a;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStackY_fd0 = (code *)0x153526;
    unlink("test_file");
    pcStackY_fd0 = (code *)0x153532;
    unlink("test_file_link");
    pcStackY_fd0 = (code *)0x15353e;
    unlink("test_file_link2");
    pcStackY_fd0 = (code *)0x153543;
    puVar5 = uv_default_loop();
    pcStackY_fd0 = (code *)0x153557;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_fd0 = (code *)0x153561;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_fd0 = (code *)0x153566;
    pcVar7 = (char *)uv_default_loop();
    pcStackY_fd0 = (code *)0x15356e;
    iVar3 = uv_loop_close((uv_loop_t *)pcVar7);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStackY_fd0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar7)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar7)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)pcVar7);
      return extraout_EAX_12;
    }
  }
  else {
    puStackY_fd8 = (uv_loop_t *)0x1535fd;
    link_cb_cold_1();
  }
  puStackY_fd8 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_fd8 = puVar5;
  loop = uv_default_loop();
  iVar3 = uv_fs_readlink(loop,&uStackY_1190,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001536f7;
    if (dummy_cb_count != 1) goto LAB_001536fc;
    if (uStackY_1190.ptr != (void *)0x0) goto LAB_00153701;
    if (uStackY_1190.result != -2) goto LAB_00153706;
    uv_fs_req_cleanup(&uStackY_1190);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_1190,"no_such_file",(uv_fs_cb)0x0);
    if (iVar3 != -2) goto LAB_0015370b;
    if (uStackY_1190.ptr != (void *)0x0) goto LAB_00153710;
    if (uStackY_1190.result == -2) {
      uv_fs_req_cleanup(&uStackY_1190);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar3 = uv_loop_close(puVar5);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0015371a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001536f7:
    run_test_fs_readlink_cold_2();
LAB_001536fc:
    run_test_fs_readlink_cold_3();
LAB_00153701:
    run_test_fs_readlink_cold_4();
LAB_00153706:
    run_test_fs_readlink_cold_5();
LAB_0015370b:
    run_test_fs_readlink_cold_6();
LAB_00153710:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015371a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_13;
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdtemp_cb_count == 1);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT(r == 0);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT(strcmp(mkdtemp_req1.path, mkdtemp_req2.path) != 0);

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}